

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

void __thiscall chrono::ChSystem::StateGatherReactions(ChSystem *this,ChVectorDynamic<> *L)

{
  element_type *peVar1;
  
  ChAssembly::IntStateGatherReactions(&this->assembly,0,L);
  peVar1 = (this->contact_container).
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1f])
            (peVar1,(ulong)((peVar1->super_ChPhysicsItem).offset_L -
                           (this->assembly).super_ChPhysicsItem.offset_L),L);
  return;
}

Assistant:

void ChSystem::StateGatherReactions(ChVectorDynamic<>& L) {
    unsigned int off_L = 0;

    // Operate on assembly sub-objects (bodies, links, etc.)
    assembly.IntStateGatherReactions(off_L, L);

    // Use also on contact container:
    unsigned int displ_L = off_L - assembly.offset_L;
    contact_container->IntStateGatherReactions(displ_L + contact_container->GetOffset_L(), L);
}